

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ReusableStringStream::ReusableStringStream(ReusableStringStream *this)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  size_t sVar2;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00191678;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar2 = StringStreams::add(&pSVar1->super_StringStreams);
  this->m_index = sVar2;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  this->m_oss = (ostream *)
                (pSVar1->super_StringStreams).m_streams.
                super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_index]._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  return;
}

Assistant:

ReusableStringStream::ReusableStringStream()
    :   m_index( Singleton<StringStreams>::getMutable().add() ),
        m_oss( Singleton<StringStreams>::getMutable().m_streams[m_index].get() )
    {}